

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O1

int check_uncompressed(test_state *state)

{
  int iVar1;
  uchar *puVar2;
  
  if (0 < (long)state->buf_len) {
    iVar1 = state->bytes_per_sample;
    puVar2 = state->ubuf;
    do {
      (*state->out)(puVar2,state->xmax,iVar1);
      (*state->out)(puVar2 + iVar1,state->xmin,iVar1);
      puVar2 = puVar2 + iVar1 * 2;
    } while (puVar2 < state->ubuf + state->buf_len);
  }
  printf("Checking uncompressed ... ");
  iVar1 = check_block_sizes(state,~(uint)(-1L << ((byte)state->id_len & 0x3f)),state->id_len);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int check_uncompressed(struct test_state *state)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    for (tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * size) {
        state->out(tmp, state->xmax, size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking uncompressed ... ");
    status = check_block_sizes(state,
                               (1ULL << state->id_len) - 1,
                               state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}